

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
ArrayState<true>::Float(ArrayState<true> *this,Context<true> *ctx,float f)

{
  pointer pNVar1;
  feature_index i;
  ostream *poVar2;
  char *local_1c0 [4];
  stringstream str;
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  poVar2 = std::operator<<(&local_190,'[');
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,']');
  pNVar1 = (ctx->namespace_path).
           super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  i = this->array_hash;
  std::__cxx11::stringbuf::str();
  Namespace<true>::AddFeature(pNVar1 + -1,f,i,local_1c0[0]);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  this->array_hash = this->array_hash + 1;
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    if (audit)
    {
      stringstream str;
      str << '[' << (array_hash - ctx.CurrentNamespace().namespace_hash) << ']';

      ctx.CurrentNamespace().AddFeature(f, array_hash, str.str().c_str());
    }
    else
      ctx.CurrentNamespace().AddFeature(f, array_hash, nullptr);
    array_hash++;

    return this;
  }